

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_extract.c
# Opt level: O1

void test_read_extract(void)

{
  uint uVar1;
  int iVar2;
  wchar_t wVar3;
  void *pvVar4;
  void *buff;
  archive *paVar5;
  ssize_t sVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  archive_entry *ae;
  size_t used;
  archive_entry *local_58;
  uint local_4c;
  void *local_48;
  void *local_40;
  size_t local_38;
  
  pvVar4 = malloc(1000000);
  buff = malloc(100000);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                  ,L'+',L'\x12');
  paVar5 = archive_write_new();
  lVar9 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'.',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'/',(uint)(iVar2 == 0),"0 == archive_write_set_format_ustar(a)",paVar5);
  iVar2 = archive_write_add_filter_none(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'0',(uint)(iVar2 == 0),"0 == archive_write_add_filter_none(a)",paVar5);
  local_48 = pvVar4;
  iVar2 = archive_write_open_memory(paVar5,pvVar4,1000000,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'1',(uint)(iVar2 == 0),
                   "0 == archive_write_open_memory(a, buff, BUFF_SIZE, &used)",paVar5);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'4',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"dir_0775");
  archive_entry_set_mode(local_58,0x41fd);
  iVar2 = archive_write_header(paVar5,local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'7',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_58);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L';',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"file");
  archive_entry_set_mode(local_58,0x81ed);
  do {
    iVar2 = rand();
    *(char *)((long)buff + lVar9) = (char)iVar2;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 100000);
  archive_entry_set_size(local_58,100000);
  iVar2 = archive_write_header(paVar5,local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'A',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
  local_40 = buff;
  sVar6 = archive_write_data(paVar5,buff,100000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'B',(uint)(sVar6 == 100000),
                   "FILE_BUFF_SIZE == archive_write_data(a, file_buff, FILE_BUFF_SIZE)",paVar5);
  archive_entry_free(local_58);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'F',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"dir");
  archive_entry_set_mode(local_58,0x41ff);
  iVar2 = archive_write_header(paVar5,local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'I',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_58);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'M',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"dir/file");
  archive_entry_set_mode(local_58,0x81c0);
  iVar2 = archive_write_header(paVar5,local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'P',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_58);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'T',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"dir2/file");
  archive_entry_set_mode(local_58,0x8000);
  iVar2 = archive_write_header(paVar5,local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'W',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_58);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'[',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"dir3/.");
  archive_entry_set_mode(local_58,0x41c8);
  iVar2 = archive_write_header(paVar5,local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'^',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_58);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'b',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"dir4/a/../b/../c/");
  archive_entry_set_mode(local_58,0x41c9);
  iVar2 = archive_write_header(paVar5,local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'e',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_58);
  wVar3 = canSymlink();
  if (wVar3 == L'\0') {
    local_4c = 7;
  }
  else {
    local_58 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                     ,L'j',(uint)(local_58 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(local_58,"symlink");
    archive_entry_set_mode(local_58,0xa1ed);
    archive_entry_set_symlink(local_58,"file");
    iVar2 = archive_write_header(paVar5,local_58);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                     ,L'n',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_58);
    local_4c = 8;
  }
  iVar2 = archive_write_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                      ,L'r',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar5);
  iVar2 = archive_write_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                      ,L's',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'v',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'w',(uint)(iVar2 == 0),"0 == archive_read_support_format_all(a)",paVar5);
  iVar2 = archive_read_support_filter_all(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'x',(uint)(iVar2 == 0),"0 == archive_read_support_filter_all(a)",paVar5);
  iVar2 = archive_read_open_memory(paVar5,local_48,1000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'y',(uint)(iVar2 == 0),"0 == archive_read_open_memory(a, buff, BUFF_SIZE)",
                   paVar5);
  failure("Error reading first entry",100000);
  iVar2 = archive_read_next_header(paVar5,&local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'|',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",paVar5);
  iVar2 = archive_read_extract(paVar5,local_58,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'}',(uint)(iVar2 == 0),"0 == archive_read_extract(a, ae, ARCHIVE_EXTRACT_PERM)"
                   ,paVar5);
  uVar1 = local_4c;
  uVar8 = 1;
  do {
    failure("Error reading entry %d",(ulong)uVar8);
    iVar2 = archive_read_next_header(paVar5,&local_58);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                     ,L'\x81',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",paVar5);
    pcVar7 = archive_entry_pathname(local_58);
    failure("Failed to extract entry %d: %s",(ulong)uVar8,pcVar7);
    iVar2 = archive_read_extract(paVar5,local_58,0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                     ,L'\x84',(uint)(iVar2 == 0),"0 == archive_read_extract(a, ae, 0)",paVar5);
    uVar8 = uVar8 + 1;
  } while (uVar1 != uVar8);
  iVar2 = archive_read_next_header(paVar5,&local_58);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x86',(uint)(iVar2 == 1),"ARCHIVE_EOF == archive_read_next_header(a, &ae)",
                   paVar5);
  iVar2 = archive_read_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar5);
  iVar2 = archive_read_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                      ,L'\x88',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  failure("This was 0775 in archive, and should be 0775 on disk");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x90',"dir_0775",L'ǽ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x93',"file",L'ǭ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                      ,L'\x94',"file",100000);
  pvVar4 = local_40;
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
             ,L'\x95',local_40,L'𘚠',"file");
  failure("This was 0777 in archive, but umask should make it 0755");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x9a',"dir",L'ǭ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x9b',"dir/file",L'ǀ');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x9c',"dir2",L'ǭ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x9d',"dir2/file",L'\0');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x9e',"dir3",L'ǈ');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\x9f',"dir4",L'ǭ');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'\xa0',"dir4/a",L'ǭ');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'¡',"dir4/b",L'ǭ');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
                   ,L'¢',"dir4/c",L'ǉ');
  wVar3 = canSymlink();
  if (wVar3 != L'\0') {
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_extract.c"
               ,L'¤',"symlink","file");
  }
  free(local_48);
  free(pvVar4);
  return;
}

Assistant:

DEFINE_TEST(test_read_extract)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int i, numEntries = 0;
	char *buff, *file_buff;

	buff = malloc(BUFF_SIZE);
	file_buff = malloc(FILE_BUFF_SIZE);

	/* Force the umask to something predictable. */
	assertUmask(022);

	/* Create a new archive in memory containing various types of entries. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, BUFF_SIZE, &used));
	/* A directory to be restored with EXTRACT_PERM. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir_0775");
	archive_entry_set_mode(ae, S_IFDIR | 0775);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A regular file. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	for (i = 0; i < FILE_BUFF_SIZE; i++)
		file_buff[i] = (unsigned char)rand();
	archive_entry_set_size(ae, FILE_BUFF_SIZE);
	assertA(0 == archive_write_header(a, ae));
	assertA(FILE_BUFF_SIZE == archive_write_data(a, file_buff, FILE_BUFF_SIZE));
	archive_entry_free(ae);
	/* A directory that should obey umask when restored. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A file in the directory. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir/file");
	archive_entry_set_mode(ae, S_IFREG | 0700);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A file in a dir that is not already in the archive. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir2/file");
	archive_entry_set_mode(ae, S_IFREG | 0000);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A dir with a trailing /. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir3/.");
	archive_entry_set_mode(ae, S_IFDIR | 0710);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* Multiple dirs with a single entry. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir4/a/../b/../c/");
	archive_entry_set_mode(ae, S_IFDIR | 0711);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A symlink. */
	if (canSymlink()) {
		++numEntries;
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "symlink");
		archive_entry_set_mode(ae, AE_IFLNK | 0755);
		archive_entry_set_symlink(ae, "file");
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);
	}
	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Extract the entries to disk. */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, BUFF_SIZE));
	/* Restore first entry with _EXTRACT_PERM. */
	failure("Error reading first entry", i);
	assertA(0 == archive_read_next_header(a, &ae));
	assertA(0 == archive_read_extract(a, ae, ARCHIVE_EXTRACT_PERM));
	/* Rest of entries get restored with no flags. */
	for (i = 1; i < numEntries; i++) {
		failure("Error reading entry %d", i);
		assertA(0 == archive_read_next_header(a, &ae));
		failure("Failed to extract entry %d: %s", i,
			archive_entry_pathname(ae));
		assertA(0 == archive_read_extract(a, ae, 0));
	}
	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Test the entries on disk. */
	/* This first entry was extracted with ARCHIVE_EXTRACT_PERM,
	 * so the permissions should have been restored exactly,
	 * including resetting the gid bit on those platforms
	 * where gid is inherited by subdirs. */
	failure("This was 0775 in archive, and should be 0775 on disk");
	assertIsDir("dir_0775", 0775);
	/* Everything else was extracted without ARCHIVE_EXTRACT_PERM,
	 * so there may be some sloppiness about gid bits on directories. */
	assertIsReg("file", 0755);
	assertFileSize("file", FILE_BUFF_SIZE);
	assertFileContents(file_buff, FILE_BUFF_SIZE, "file");
	/* If EXTRACT_PERM wasn't used, be careful to ignore sgid bit
	 * when checking dir modes, as some systems inherit sgid bit
	 * from the parent dir. */
	failure("This was 0777 in archive, but umask should make it 0755");
	assertIsDir("dir", 0755);
	assertIsReg("dir/file", 0700);
	assertIsDir("dir2", 0755);
	assertIsReg("dir2/file", 0000);
	assertIsDir("dir3", 0710);
	assertIsDir("dir4", 0755);
	assertIsDir("dir4/a", 0755);
	assertIsDir("dir4/b", 0755);
	assertIsDir("dir4/c", 0711);
	if (canSymlink())
		assertIsSymlink("symlink", "file");

	free(buff);
	free(file_buff);
}